

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

void __thiscall
ON_BumpFunction::Evaluate(ON_BumpFunction *this,double s,double t,int der_count,double *value)

{
  double *value_00;
  double dt;
  double dt_00;
  double *value_01;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ON_BumpFunction *this_00;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double tmp [20];
  double local_d8 [21];
  
  if (der_count < 10) {
    value_01 = local_d8;
    this_00 = this;
  }
  else {
    this_00 = (ON_BumpFunction *)((ulong)(der_count * 2 + 2) << 3);
    value_01 = (double *)onmalloc((size_t)this_00);
  }
  lVar4 = (long)(int)(der_count + 1U);
  dVar6 = s - this->m_x0;
  dt = this->m_sx[0.0 <= dVar6];
  dVar7 = t - this->m_y0;
  dVar6 = dVar6 * dt;
  dt_00 = this->m_sy[0.0 <= dVar7];
  if (this->m_type[0] == 5) {
    Internal_EvaluateQuinticBump(this_00,dVar6,dt,der_count,value_01);
  }
  else {
    *value_01 = dVar6;
    if ((0 < der_count) && (value_01[1] = dt, der_count != 1)) {
      this_00 = (ON_BumpFunction *)(value_01 + 2);
      memset(this_00,0,(ulong)(der_count - 1) << 3);
    }
  }
  value_00 = value_01 + lVar4;
  dVar7 = dVar7 * dt_00;
  if (this->m_type[1] == 5) {
    Internal_EvaluateQuinticBump(this_00,dVar7,dt_00,der_count,value_00);
  }
  else {
    *value_00 = dVar7;
    if ((0 < der_count) && (value_00[1] = dt_00, der_count != 1)) {
      memset(value_00 + 2,0,(ulong)(der_count - 1) << 3);
    }
  }
  if (-1 < der_count) {
    uVar3 = 0;
    lVar2 = lVar4;
    uVar1 = uVar3;
    do {
      do {
        *value = this->m_a * value_01[uVar3] * value_01[lVar2];
        value = value + 1;
        bVar5 = uVar3 != 0;
        uVar3 = uVar3 - 1;
        lVar2 = lVar2 + 1;
      } while (bVar5);
      uVar3 = uVar1 + 1;
      lVar2 = lVar4;
      uVar1 = uVar3;
    } while (uVar3 != der_count + 1U);
  }
  return;
}

Assistant:

void ON_BumpFunction::Evaluate(double s, double t, int der_count, double* value) const
{
  double tmp[20];
  double* xvalue;
  double* yvalue;
  xvalue = ( der_count > 9 ) 
         ? ((double*)onmalloc((der_count+1)*2*sizeof(xvalue[0])))
         : &tmp[0];
  yvalue = xvalue + (der_count+1);
  double x = s-m_x0;
  const double dx = m_sx[x >= 0.0 ? 1 : 0];
  x *= dx;
  double y = t-m_y0;
  const double dy = m_sy[y >= 0.0 ? 1 : 0];
  y *= dy;

  if ( 5 == m_type[0] )
  {
    Internal_EvaluateQuinticBump(x,dx,der_count,xvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(x,dx,der_count,xvalue);
  }
  if ( 5 == m_type[1] )
  {
    Internal_EvaluateQuinticBump(y,dy,der_count,yvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(y,dy,der_count,yvalue);
  }

  int n, i, j;
  for ( n = 0; n <= der_count; n++ )
  {
    for ( i = n, j = 0; j <= n; i--, j++ )
    {
      *value++ = m_a*xvalue[i]*yvalue[j]; // d^nf/(ds^i dt^j)
    }
  }
}